

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O1

int Ssc_GiaSimulatePatternFraig_rec(Ssc_Man_t *p,int iFraigObj)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  if (-1 < iFraigObj) {
    if (iFraigObj < p->vId2Var->nSize) {
      uVar3 = p->vId2Var->pArray[(uint)iFraigObj];
      if ((ulong)uVar3 == 0) {
        if (p->pFraig->nObjs <= iFraigObj) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar1 = p->pFraig->pObjs;
        uVar3 = (uint)*(undefined8 *)(pGVar1 + (uint)iFraigObj);
        if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                        ,0xab,"int Ssc_GiaSimulatePatternFraig_rec(Ssc_Man_t *, int)");
        }
        pGVar1 = pGVar1 + (uint)iFraigObj;
        uVar3 = Ssc_GiaSimulatePatternFraig_rec(p,iFraigObj - (uVar3 & 0x1fffffff));
        uVar4 = Ssc_GiaSimulatePatternFraig_rec
                          (p,iFraigObj - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff));
        uVar2 = *(ulong *)pGVar1;
        uVar3 = ((uint)(uVar2 >> 0x3d) & 1 ^ uVar4) & ((uint)(uVar2 >> 0x1d) & 7 ^ uVar3);
        *(ulong *)pGVar1 = uVar2 & 0xffffffffbfffffff | (ulong)(uVar3 << 0x1e);
      }
      else {
        if (((int)uVar3 < 0) || (p->pSat->size <= (int)uVar3)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
        }
        uVar3 = (uint)(p->pSat->model[uVar3] == 1);
      }
      return uVar3;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Ssc_GiaSimulatePatternFraig_rec( Ssc_Man_t * p, int iFraigObj )
{
    Gia_Obj_t * pObj;
    int Res0, Res1;
    if ( Ssc_ObjSatVar(p, iFraigObj) )
        return sat_solver_var_value( p->pSat, Ssc_ObjSatVar(p, iFraigObj) );
    pObj = Gia_ManObj( p->pFraig, iFraigObj );
    assert( Gia_ObjIsAnd(pObj) );
    Res0 = Ssc_GiaSimulatePatternFraig_rec( p, Gia_ObjFaninId0(pObj, iFraigObj) );
    Res1 = Ssc_GiaSimulatePatternFraig_rec( p, Gia_ObjFaninId1(pObj, iFraigObj) );
    pObj->fMark0 = (Res0 ^ Gia_ObjFaninC0(pObj)) & (Res1 ^ Gia_ObjFaninC1(pObj));
    return pObj->fMark0;
}